

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_2.cpp
# Opt level: O0

void increment_day(Date *d)

{
  bool bVar1;
  int iVar2;
  Date *d_local;
  
  iVar2 = d->m;
  if (iVar2 != 1) {
    if (iVar2 == 2) {
      bVar1 = is_leap(d);
      if (bVar1) {
        iVar2 = next_val(0x1d,d->d);
        d->d = iVar2;
      }
      else {
        iVar2 = next_val(0x1c,d->d);
        d->d = iVar2;
      }
      goto LAB_0010289d;
    }
    if ((((iVar2 != 3) && (iVar2 != 5)) && (1 < iVar2 - 7U)) && ((iVar2 != 10 && (iVar2 != 0xc)))) {
      iVar2 = next_val(0x1e,d->d);
      d->d = iVar2;
      goto LAB_0010289d;
    }
  }
  iVar2 = next_val(0x1f,d->d);
  d->d = iVar2;
LAB_0010289d:
  if (d->d == 1) {
    iVar2 = next_val(0xc,d->m);
    d->m = iVar2;
    if (d->m == 1) {
      d->y = d->y + 1;
    }
  }
  return;
}

Assistant:

void increment_day(Date& d)
{
	switch (d.m)
	{
	case 2:
	{
		if (is_leap(d))
			d.d = next_val(29, d.d);
		else
			d.d = next_val(28, d.d);
		break;
	}
	case 1:
	case 3:
	case 5:
	case 7:
	case 8:
	case 10:
	case 12:
		d.d = next_val(31, d.d);
		break;
	default:
		d.d = next_val(30, d.d);
	}

	// handles case when next day is the first day of next month
	if (d.d == 1)
	{
		d.m = next_val(12, d.m);
		if (d.m == 1)
			++d.y;
	}
}